

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::ValidateTestPropertyName
               (string *property_name,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *reserved_names)

{
  const_iterator this;
  const_iterator message;
  AssertHelper *this_00;
  Message *file;
  Message *pMVar1;
  AssertHelper *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff60;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff68;
  int line;
  Type type;
  Message *in_stack_ffffffffffffff80;
  string local_70 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff98;
  undefined1 local_40 [8];
  bool local_1;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_ffffffffffffff48);
  this = std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(in_stack_ffffffffffffff48);
  std::
  find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  message = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(in_stack_ffffffffffffff48);
  local_1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff50,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffff48);
  if (local_1) {
    type = (Type)((ulong)local_40 >> 0x20);
    Message::Message(in_stack_ffffffffffffff80);
    this_00 = (AssertHelper *)
              Message::operator<<((Message *)in_stack_ffffffffffffff50,
                                  (char (*) [40])in_stack_ffffffffffffff48);
    file = Message::operator<<((Message *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    pMVar1 = Message::operator<<((Message *)in_stack_ffffffffffffff50,
                                 (char (*) [3])in_stack_ffffffffffffff48);
    line = (int)((ulong)pMVar1 >> 0x20);
    FormatWordList(in_stack_ffffffffffffff98);
    pMVar1 = Message::operator<<((Message *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    Message::operator<<((Message *)in_stack_ffffffffffffff50,
                        (char (*) [18])in_stack_ffffffffffffff48);
    this_01 = (AssertHelper *)
              Message::operator<<((Message *)in_stack_ffffffffffffff50,
                                  (char (*) [12])in_stack_ffffffffffffff48);
    Message::operator<<((Message *)this_01,(char (*) [2])in_stack_ffffffffffffff48);
    internal::AssertHelper::AssertHelper(this_00,type,(char *)file,line,(char *)pMVar1);
    internal::AssertHelper::operator=((AssertHelper *)this._M_current,(Message *)message._M_current)
    ;
    internal::AssertHelper::~AssertHelper(this_01);
    std::__cxx11::string::~string(local_70);
    Message::~Message((Message *)0x146d64);
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

static bool ValidateTestPropertyName(
    const std::string& property_name,
    const std::vector<std::string>& reserved_names) {
  if (std::find(reserved_names.begin(), reserved_names.end(), property_name) !=
      reserved_names.end()) {
    ADD_FAILURE() << "Reserved key used in RecordProperty(): " << property_name
                  << " (" << FormatWordList(reserved_names)
                  << " are reserved by " << GTEST_NAME_ << ")";
    return false;
  }
  return true;
}